

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

ByteData *
cfd::core::AdaptorUtil::Adapt
          (ByteData *__return_storage_ptr__,AdaptorSignature *adaptor_signature,Privkey *sk)

{
  undefined8 ctx_00;
  int iVar1;
  secp256k1_context_struct *ctx_01;
  uchar *puVar2;
  uchar *adaptor_sig65;
  CfdException *pCVar3;
  allocator local_149;
  string local_148;
  allocator<unsigned_char> local_121;
  undefined1 local_120 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  string local_100;
  ByteData local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  ByteData local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  int local_6c;
  undefined1 local_68 [4];
  int ret;
  secp256k1_ecdsa_signature secp_signature;
  secp256k1_context_struct *ctx;
  Privkey *sk_local;
  AdaptorSignature *adaptor_signature_local;
  
  ctx_01 = wally_get_secp_context();
  secp_signature.data._56_8_ = ctx_01;
  Privkey::GetData(&local_a0,sk);
  ByteData::GetBytes(&local_88,&local_a0);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  AdaptorSignature::GetData(&local_e0,adaptor_signature);
  ByteData::GetBytes(&local_c8,&local_e0);
  adaptor_sig65 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
  iVar1 = secp256k1_ecdsa_adaptor_adapt
                    (ctx_01,(secp256k1_ecdsa_signature *)local_68,puVar2,adaptor_sig65);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
  ByteData::~ByteData(&local_e0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  ByteData::~ByteData(&local_a0);
  local_6c = iVar1;
  if (iVar1 != 1) {
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_100,"Could not adapt signature.",
               (allocator *)
               ((long)&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar3,kCfdInternalError,&local_100);
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator(&local_121);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,0x40,&local_121);
  ::std::allocator<unsigned_char>::~allocator(&local_121);
  ctx_00 = secp_signature.data._56_8_;
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
  secp256k1_ecdsa_signature_serialize_compact
            ((secp256k1_context *)ctx_00,puVar2,(secp256k1_ecdsa_signature *)local_68);
  if (local_6c != 1) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_148,"Could not serialize signature.",&local_149)
    ;
    CfdException::CfdException(pCVar3,kCfdInternalError,&local_148);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
  return __return_storage_ptr__;
}

Assistant:

ByteData AdaptorUtil::Adapt(
    const AdaptorSignature &adaptor_signature, const Privkey &sk) {
  auto ctx = wally_get_secp_context();
  secp256k1_ecdsa_signature secp_signature;
  auto ret = secp256k1_ecdsa_adaptor_adapt(
      ctx, &secp_signature, sk.GetData().GetBytes().data(),
      adaptor_signature.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not adapt signature.");
  }

  std::vector<uint8_t> signature(64);
  secp256k1_ecdsa_signature_serialize_compact(
      ctx, signature.data(), &secp_signature);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not serialize signature.");
  }

  return ByteData(signature);
}